

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

void __thiscall
Assimp::StreamReader<false,_false>::StreamReader
          (StreamReader<false,_false> *this,shared_ptr<Assimp::IOStream> *stream,bool le)

{
  bool bVar1;
  bool le_local;
  shared_ptr<Assimp::IOStream> *stream_local;
  StreamReader<false,_false> *this_local;
  
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&this->stream,stream);
  this->le = le;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stream);
  if (!bVar1) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StreamReader.h"
                  ,0x62,
                  "Assimp::StreamReader<>::StreamReader(std::shared_ptr<IOStream>, bool) [SwapEndianess = false, RuntimeSwitch = false]"
                 );
  }
  InternBegin(this);
  return;
}

Assistant:

StreamReader(std::shared_ptr<IOStream> stream, bool le = false)
        : stream(stream)
        , le(le)
    {
        ai_assert(stream);
        InternBegin();
    }